

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resource.cpp
# Opt level: O3

void Corrade::Utility::Resource::overrideGroup(StringView group,StringView configurationFile)

{
  _Rb_tree<Corrade::Containers::BasicStringView<char_const>,std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>,std::_Select1st<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>,std::less<Corrade::Containers::BasicStringView<char_const>>,std::allocator<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>>
  *this;
  char *pcVar1;
  size_t sVar2;
  ResourceGroup *pRVar3;
  ostream *output;
  Debug *pDVar4;
  char *pcVar5;
  char *pcVar6;
  String *this_00;
  String *pSVar7;
  String *extraout_RDX;
  pair<std::_Rb_tree_iterator<std::pair<const_Corrade::Containers::BasicStringView<const_char>,_Corrade::Containers::String>_>,_bool>
  pVar8;
  StringView view;
  StringView name;
  StringView value;
  BasicStringView<const_char> local_70;
  Error local_60;
  String local_38;
  
  local_70._sizePlusFlags = group._sizePlusFlags;
  local_70._data = group._data;
  pcVar5 = (char *)configurationFile._sizePlusFlags;
  this_00 = (String *)configurationFile._data;
  pcVar6 = pcVar5;
  pSVar7 = this_00;
  if ((_Rb_tree<Corrade::Containers::BasicStringView<char_const>,std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>,std::_Select1st<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>,std::less<Corrade::Containers::BasicStringView<char_const>>,std::allocator<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>>
       *)DAT_0017eda8 ==
      (_Rb_tree<Corrade::Containers::BasicStringView<char_const>,std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>,std::_Select1st<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>,std::less<Corrade::Containers::BasicStringView<char_const>>,std::allocator<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>>
       *)0x0) {
    if (overrideGroup(Corrade::Containers::BasicStringView<char_const>,Corrade::Containers::BasicStringView<char_const>)
        ::overrideGroups == '\0') {
      overrideGroup();
      pSVar7 = extraout_RDX;
    }
    DAT_0017eda8 = &overrideGroup::overrideGroups;
  }
  sVar2 = local_70._sizePlusFlags;
  pcVar1 = local_70._data;
  name._sizePlusFlags = (size_t)pSVar7;
  name._data = (char *)local_70._sizePlusFlags;
  pRVar3 = anon_unknown_3::findGroup((anon_unknown_3 *)local_70._data,name);
  if (pRVar3 != (ResourceGroup *)0x0) {
    view._sizePlusFlags = (size_t)pcVar6;
    view._data = pcVar5;
    Containers::String::nullTerminatedGlobalView((String *)&local_60,this_00,view);
    this = (_Rb_tree<Corrade::Containers::BasicStringView<char_const>,std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>,std::_Select1st<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>,std::less<Corrade::Containers::BasicStringView<char_const>>,std::allocator<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>>
            *)DAT_0017eda8;
    Containers::String::String(&local_38);
    pVar8 = std::
            _Rb_tree<Corrade::Containers::BasicStringView<char_const>,std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>,std::_Select1st<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>,std::less<Corrade::Containers::BasicStringView<char_const>>,std::allocator<std::pair<Corrade::Containers::BasicStringView<char_const>const,Corrade::Containers::String>>>
            ::
            _M_emplace_unique<Corrade::Containers::BasicStringView<char_const>const&,Corrade::Containers::String>
                      (this,&local_70,&local_38);
    Containers::String::operator=
              ((String *)&pVar8.first._M_node._M_node[1]._M_left,(String *)&local_60);
    Containers::String::~String(&local_38);
    Containers::String::~String((String *)&local_60);
    return;
  }
  output = Error::defaultOutput();
  Error::Error(&local_60,output,(Flags)0x0);
  pDVar4 = Debug::operator<<(&local_60.super_Debug,"Utility::Resource::overrideGroup(): group \'");
  (pDVar4->_immediateFlags)._value = (pDVar4->_immediateFlags)._value | 4;
  value._sizePlusFlags = sVar2;
  value._data = pcVar1;
  pDVar4 = Debug::operator<<(pDVar4,value);
  (pDVar4->_immediateFlags)._value = (pDVar4->_immediateFlags)._value | 4;
  Debug::operator<<(pDVar4,"\' was not found");
  Error::~Error(&local_60);
  abort();
}

Assistant:

void Resource::overrideGroup(const Containers::StringView group, const Containers::StringView configurationFile) {
    if(!resourceGlobals.overrideGroups) {
        static std::map<Containers::StringView, Containers::String> overrideGroups;
        resourceGlobals.overrideGroups = &overrideGroups;
    }

    CORRADE_ASSERT(findGroup(group),
        "Utility::Resource::overrideGroup(): group '" << Debug::nospace << group << Debug::nospace << "' was not found", );
    /* This group can be already overridden from before, so insert if not there
       yet and then update the filename */
    resourceGlobals.overrideGroups->emplace(group, Containers::String{}).first->second = Containers::String::nullTerminatedGlobalView(configurationFile);
}